

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O2

void __thiscall xray_re::xr_skl_motion::~xr_skl_motion(xr_skl_motion *this)

{
  (this->super_xr_motion)._vptr_xr_motion = (_func_int **)&PTR__xr_skl_motion_0023a358;
  delete_elements<std::vector<xray_re::xr_bone_motion*,std::allocator<xray_re::xr_bone_motion*>>>
            (&this->m_bone_motions);
  delete_elements<std::vector<xray_re::xr_motion_marks*,std::allocator<xray_re::xr_motion_marks*>>>
            (&this->m_marks);
  std::_Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>::
  ~_Vector_base(&(this->m_marks).
                 super__Vector_base<xray_re::xr_motion_marks_*,_std::allocator<xray_re::xr_motion_marks_*>_>
               );
  std::_Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>::
  ~_Vector_base(&(this->m_bone_motions).
                 super__Vector_base<xray_re::xr_bone_motion_*,_std::allocator<xray_re::xr_bone_motion_*>_>
               );
  xr_motion::~xr_motion(&this->super_xr_motion);
  return;
}

Assistant:

xr_skl_motion::~xr_skl_motion()
{
	delete_elements(m_bone_motions);
	delete_elements(m_marks);
}